

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall QDockWidget::closeEvent(QDockWidget *this,QCloseEvent *event)

{
  bool bVar1;
  Int IVar2;
  QDockWidgetPrivate *pQVar3;
  QMainWindow *pQVar4;
  long *in_RSI;
  QFlags<QDockWidget::DockWidgetFeature> *in_RDI;
  long in_FS_OFFSET;
  EndDragMode in_stack_0000000c;
  QDockWidgetPrivate *in_stack_00000010;
  bool canClose;
  QMainWindow *win;
  QDockWidgetPrivate *d;
  byte bVar5;
  DockWidgetFeature in_stack_ffffffffffffffbc;
  QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QDockWidget *)0x58fdef);
  if (pQVar3->state != (DragState *)0x0) {
    QDockWidgetPrivate::endDrag(in_stack_00000010,in_stack_0000000c);
  }
  QWidget::parentWidget((QWidget *)0x58fe1c);
  pQVar4 = qobject_cast<QMainWindow*>((QObject *)0x58fe24);
  local_c.super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i =
       (QFlagsStorage<QDockWidget::DockWidgetFeature>)
       QFlags<QDockWidget::DockWidgetFeature>::operator&(in_RDI,in_stack_ffffffffffffffbc);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  bVar5 = 1;
  if ((IVar2 == 0) && (bVar5 = 1, pQVar4 != (QMainWindow *)0x0)) {
    bVar1 = QWidget::isVisible((QWidget *)0x58fe72);
    bVar5 = bVar1 ^ 0xff;
  }
  (**(code **)(*in_RSI + 0x10))(in_RSI,bVar5 & 1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidget::closeEvent(QCloseEvent *event)
{
    Q_D(QDockWidget);
    if (d->state)
        d->endDrag(QDockWidgetPrivate::EndDragMode::Abort);

    // For non-closable widgets, don't allow closing, except when the mainwindow
    // is hidden, as otherwise an application wouldn't be able to be shut down.
    const QMainWindow *win = qobject_cast<QMainWindow*>(parentWidget());
    const bool canClose = (d->features & DockWidgetClosable)
                       || (!win || !win->isVisible());
    event->setAccepted(canClose);
}